

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O2

Image * deqp::gls::fboc::details::makeImage
                  (GLenum bufType,ImageFormat format,GLsizei width,GLsizei height,
                  FboBuilder *builder)

{
  Renderbuffer *pRVar1;
  
  if (bufType != 0) {
    if (bufType == 0x1702) {
      pRVar1 = (Renderbuffer *)
               FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Texture2D>(builder);
    }
    else {
      pRVar1 = FboUtil::FboBuilder::makeConfig<deqp::gls::FboUtil::config::Renderbuffer>(builder);
    }
    (pRVar1->super_Image).internalFormat = format;
    (pRVar1->super_Image).width = width;
    (pRVar1->super_Image).height = height;
    return &pRVar1->super_Image;
  }
  return (Image *)0x0;
}

Assistant:

Image* makeImage (GLenum bufType, ImageFormat format,
				  GLsizei width, GLsizei height, FboBuilder& builder)
{
	Image* image = DE_NULL;
	switch (bufType)
	{
		case GL_NONE:
			return DE_NULL;
		case GL_RENDERBUFFER:
			image = &builder.makeConfig<Renderbuffer>();
			break;
		case GL_TEXTURE:
			image = &builder.makeConfig<Texture2D>();
			break;
		default:
			DE_FATAL("Impossible case");
	}
	image->internalFormat = format;
	image->width = width;
	image->height = height;
	return image;
}